

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.cpp
# Opt level: O2

FeatureSet __thiscall wasm::Type::getFeatures(Type *this)

{
  ulong uVar1;
  size_t sVar2;
  FeatureSet FVar3;
  BasicType BVar4;
  Type *pTVar5;
  Type in_RSI;
  uint uVar6;
  Type *pTVar7;
  Iterator IVar8;
  undefined1 local_48 [8];
  Iterator __begin2;
  
  uVar1 = this->id;
  if ((uVar1 & 1) != 0 && 6 < uVar1) {
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)0x0;
    local_48 = (undefined1  [8])this;
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
         (size_t)this;
    IVar8 = end(this);
    sVar2 = __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    uVar6 = 0x200;
    pTVar5 = (Type *)0x1;
    while (pTVar7 = pTVar5,
          (long)pTVar7 -
          IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index != 1 ||
          IVar8.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent !=
          (Type *)sVar2) {
      pTVar5 = Iterator::operator*((Iterator *)local_48);
      FVar3 = getFeatures::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)pTVar5->id,in_RSI);
      uVar6 = uVar6 | FVar3.features;
      __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = pTVar7;
      pTVar5 = (Type *)((long)&pTVar7->id + 1);
    }
    return (FeatureSet)uVar6;
  }
  if ((uVar1 & 1) == 0 && 6 < uVar1) {
    getHeapType((Type *)&stack0xfffffffffffffff0);
    FVar3 = HeapType::getFeatures((HeapType *)&stack0xffffffffffffffe8);
  }
  else {
    BVar4 = getBasic((Type *)&stack0xfffffffffffffff0);
    FVar3.features = (uint)(BVar4 == v128) << 3;
  }
  return (FeatureSet)FVar3.features;
}

Assistant:

FeatureSet Type::getFeatures() const {
  auto getSingleFeatures = [](Type t) -> FeatureSet {
    if (t.isRef()) {
      return t.getHeapType().getFeatures();
    }

    switch (t.getBasic()) {
      case Type::v128:
        return FeatureSet::SIMD;
      default:
        return FeatureSet::MVP;
    }
  };

  if (isTuple()) {
    FeatureSet feats = FeatureSet::Multivalue;
    for (const auto& t : *this) {
      feats |= getSingleFeatures(t);
    }
    return feats;
  }
  return getSingleFeatures(*this);
}